

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O0

void ogt_stream_from_paletted_voxels_simple
               (uint8_t *voxels,uint32_t size_x,uint32_t size_y,uint32_t size_z,
               ogt_mesh_rgba *palette,ogt_voxel_simple_stream_func stream_func,
               void *stream_func_data)

{
  ogt_mesh_rgba color_00;
  uint32_t *puVar1;
  float fVar2;
  uint32_t uVar3;
  int iVar4;
  float pos_z_00;
  float pos_z_01;
  float pos_y_00;
  float pos_y_01;
  float pos_x_00;
  float pos_x_01;
  bool local_7ae;
  bool local_7ad;
  bool local_7ac;
  bool local_7ab;
  bool local_7aa;
  bool local_7a9;
  ogt_mesh_vertex local_7a4;
  ogt_mesh_rgba local_784;
  ogt_mesh_vertex local_780;
  ogt_mesh_rgba local_760;
  ogt_mesh_vertex local_75c;
  ogt_mesh_rgba local_73c;
  ogt_mesh_vertex local_738;
  ogt_mesh_rgba local_718;
  ogt_mesh_vertex local_714;
  ogt_mesh_rgba local_6f4;
  ogt_mesh_vertex local_6f0;
  ogt_mesh_rgba local_6d0;
  ogt_mesh_vertex local_6cc;
  ogt_mesh_rgba local_6ac;
  ogt_mesh_vertex local_6a8;
  ogt_mesh_rgba local_688;
  ogt_mesh_vertex local_684;
  ogt_mesh_rgba local_664;
  ogt_mesh_vertex local_660;
  ogt_mesh_rgba local_640;
  ogt_mesh_vertex local_63c;
  ogt_mesh_rgba local_61c;
  ogt_mesh_vertex local_618;
  ogt_mesh_rgba local_5f8;
  ogt_mesh_vertex local_5f4;
  ogt_mesh_rgba local_5d4;
  ogt_mesh_vertex local_5d0;
  ogt_mesh_rgba local_5b0;
  ogt_mesh_vertex local_5ac;
  ogt_mesh_rgba local_58c;
  ogt_mesh_vertex local_588;
  ogt_mesh_rgba local_568;
  ogt_mesh_vertex local_564;
  ogt_mesh_rgba local_544;
  ogt_mesh_vertex local_540;
  ogt_mesh_rgba local_520;
  ogt_mesh_vertex local_51c;
  ogt_mesh_rgba local_4fc;
  ogt_mesh_vertex local_4f8;
  ogt_mesh_rgba local_4d8;
  ogt_mesh_vertex local_4d4;
  ogt_mesh_rgba local_4b4;
  ogt_mesh_vertex local_4b0;
  ogt_mesh_rgba local_490;
  ogt_mesh_vertex local_48c;
  ogt_mesh_rgba local_46c;
  ogt_mesh_vertex local_468;
  ogt_mesh_vertex **local_448;
  uint32_t *current_index;
  ogt_mesh_vertex *current_vertex;
  uint32_t local_index [36];
  ogt_mesh_vertex local_vertex [24];
  uint32_t face_count_needed;
  uint32_t pos_z;
  uint32_t neg_z;
  uint32_t pos_y;
  uint32_t neg_y;
  uint32_t pos_x;
  uint32_t neg_x;
  float max_x;
  float min_x;
  ogt_mesh_rgba color;
  int32_t i;
  float max_y;
  float min_y;
  int32_t j;
  float max_z;
  float min_z;
  int32_t k;
  uint32_t total_index_count;
  uint32_t total_vertex_count;
  uint8_t *current_voxel;
  int32_t k_max_z;
  int32_t k_max_y;
  int32_t k_max_x;
  int32_t k_stride_z;
  int32_t k_stride_y;
  int32_t k_stride_x;
  ogt_voxel_simple_stream_func stream_func_local;
  ogt_mesh_rgba *palette_local;
  uint32_t size_z_local;
  uint32_t size_y_local;
  uint32_t size_x_local;
  uint8_t *voxels_local;
  
  if (stream_func == (ogt_voxel_simple_stream_func)0x0) {
    __assert_fail("stream_func",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                  ,0x24b,
                  "void ogt_stream_from_paletted_voxels_simple(const uint8_t *, uint32_t, uint32_t, uint32_t, const ogt_mesh_rgba *, ogt_voxel_simple_stream_func, void *)"
                 );
  }
  k = 0;
  _total_index_count = voxels;
  for (max_z = 0.0; (int)max_z < (int)size_z; max_z = (float)((int)max_z + 1)) {
    pos_z_00 = (float)(int)max_z;
    pos_z_01 = pos_z_00 + 1.0;
    for (max_y = 0.0; (int)max_y < (int)size_y; max_y = (float)((int)max_y + 1)) {
      pos_y_00 = (float)(int)max_y;
      pos_y_01 = pos_y_00 + 1.0;
      for (min_x = 0.0; (int)min_x < (int)size_x; min_x = (float)((int)min_x + 1)) {
        if (*_total_index_count != 0) {
          color_00 = palette[*_total_index_count];
          pos_x_00 = (float)(int)min_x;
          pos_x_01 = pos_x_00 + 1.0;
          local_7a9 = true;
          if (min_x != 0.0) {
            local_7a9 = _total_index_count[-1] == 0;
          }
          local_7aa = true;
          if (min_x != (float)(size_x - 1)) {
            local_7aa = _total_index_count[1] == 0;
          }
          local_7ab = true;
          if (max_y != 0.0) {
            local_7ab = _total_index_count[(int)-size_x] == 0;
          }
          local_7ac = true;
          if (max_y != (float)(size_y - 1)) {
            local_7ac = _total_index_count[(int)size_x] == 0;
          }
          local_7ad = true;
          if (max_z != 0.0) {
            local_7ad = _total_index_count[(int)-(size_x * size_y)] == 0;
          }
          local_7ae = true;
          if (max_z != (float)(size_z - 1)) {
            local_7ae = _total_index_count[(int)(size_x * size_y)] == 0;
          }
          iVar4 = (uint)local_7a9 + (uint)local_7aa + (uint)local_7ab + (uint)local_7ac +
                  (uint)local_7ad + (uint)local_7ae;
          if (iVar4 != 0) {
            current_index = local_index + 0x22;
            local_448 = &current_vertex;
            if (local_7a9 != 0) {
              local_46c = color_00;
              _mesh_make_vertex(&local_468,pos_x_00,pos_y_00,pos_z_00,-1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              fVar2 = local_468.pos.y;
              puVar1 = current_index;
              puVar1[0] = (uint32_t)local_468.pos.x;
              puVar1[1] = (uint32_t)fVar2;
              fVar2 = local_468.normal.x;
              puVar1[2] = (uint32_t)local_468.pos.z;
              puVar1[3] = (uint32_t)fVar2;
              fVar2 = local_468.normal.z;
              puVar1[4] = (uint32_t)local_468.normal.y;
              puVar1[5] = (uint32_t)fVar2;
              uVar3 = local_468.palette_index;
              puVar1[6] = (uint32_t)local_468.color;
              puVar1[7] = uVar3;
              local_490 = color_00;
              _mesh_make_vertex(&local_48c,pos_x_00,pos_y_01,pos_z_00,-1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              fVar2 = local_48c.pos.y;
              puVar1 = current_index;
              puVar1[8] = (uint32_t)local_48c.pos.x;
              puVar1[9] = (uint32_t)fVar2;
              fVar2 = local_48c.normal.x;
              puVar1[10] = (uint32_t)local_48c.pos.z;
              puVar1[0xb] = (uint32_t)fVar2;
              fVar2 = local_48c.normal.z;
              puVar1[0xc] = (uint32_t)local_48c.normal.y;
              puVar1[0xd] = (uint32_t)fVar2;
              uVar3 = local_48c.palette_index;
              puVar1[0xe] = (uint32_t)local_48c.color;
              puVar1[0xf] = uVar3;
              local_4b4 = color_00;
              _mesh_make_vertex(&local_4b0,pos_x_00,pos_y_01,pos_z_01,-1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              fVar2 = local_4b0.pos.y;
              puVar1 = current_index;
              puVar1[0x10] = (uint32_t)local_4b0.pos.x;
              puVar1[0x11] = (uint32_t)fVar2;
              fVar2 = local_4b0.normal.x;
              puVar1[0x12] = (uint32_t)local_4b0.pos.z;
              puVar1[0x13] = (uint32_t)fVar2;
              fVar2 = local_4b0.normal.z;
              puVar1[0x14] = (uint32_t)local_4b0.normal.y;
              puVar1[0x15] = (uint32_t)fVar2;
              uVar3 = local_4b0.palette_index;
              puVar1[0x16] = (uint32_t)local_4b0.color;
              puVar1[0x17] = uVar3;
              local_4d8 = color_00;
              _mesh_make_vertex(&local_4d4,pos_x_00,pos_y_00,pos_z_01,-1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              fVar2 = local_4d4.pos.y;
              puVar1 = current_index;
              puVar1[0x18] = (uint32_t)local_4d4.pos.x;
              puVar1[0x19] = (uint32_t)fVar2;
              fVar2 = local_4d4.normal.x;
              puVar1[0x1a] = (uint32_t)local_4d4.pos.z;
              puVar1[0x1b] = (uint32_t)fVar2;
              fVar2 = local_4d4.normal.z;
              puVar1[0x1c] = (uint32_t)local_4d4.normal.y;
              puVar1[0x1d] = (uint32_t)fVar2;
              uVar3 = local_4d4.palette_index;
              puVar1[0x1e] = (uint32_t)local_4d4.color;
              puVar1[0x1f] = uVar3;
              *(int32_t *)local_448 = k + 2;
              *(int32_t *)((long)local_448 + 4) = k + 1;
              *(int32_t *)(local_448 + 1) = k;
              *(int32_t *)((long)local_448 + 0xc) = k;
              *(int32_t *)(local_448 + 2) = k + 3;
              *(int32_t *)((long)local_448 + 0x14) = k + 2;
              k = k + 4;
              current_index = current_index + 0x20;
              local_448 = local_448 + 3;
            }
            if (local_7aa != 0) {
              local_4fc = color_00;
              _mesh_make_vertex(&local_4f8,pos_x_01,pos_y_00,pos_z_00,1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0] = (uint32_t)local_4f8.pos.x;
              current_index[1] = (uint32_t)local_4f8.pos.y;
              current_index[2] = (uint32_t)local_4f8.pos.z;
              current_index[3] = (uint32_t)local_4f8.normal.x;
              current_index[4] = (uint32_t)local_4f8.normal.y;
              current_index[5] = (uint32_t)local_4f8.normal.z;
              current_index[6] = (uint32_t)local_4f8.color;
              current_index[7] = local_4f8.palette_index;
              local_520 = color_00;
              _mesh_make_vertex(&local_51c,pos_x_01,pos_y_01,pos_z_00,1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[8] = (uint32_t)local_51c.pos.x;
              current_index[9] = (uint32_t)local_51c.pos.y;
              current_index[10] = (uint32_t)local_51c.pos.z;
              current_index[0xb] = (uint32_t)local_51c.normal.x;
              current_index[0xc] = (uint32_t)local_51c.normal.y;
              current_index[0xd] = (uint32_t)local_51c.normal.z;
              current_index[0xe] = (uint32_t)local_51c.color;
              current_index[0xf] = local_51c.palette_index;
              local_544 = color_00;
              _mesh_make_vertex(&local_540,pos_x_01,pos_y_01,pos_z_01,1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x10] = (uint32_t)local_540.pos.x;
              current_index[0x11] = (uint32_t)local_540.pos.y;
              current_index[0x12] = (uint32_t)local_540.pos.z;
              current_index[0x13] = (uint32_t)local_540.normal.x;
              current_index[0x14] = (uint32_t)local_540.normal.y;
              current_index[0x15] = (uint32_t)local_540.normal.z;
              current_index[0x16] = (uint32_t)local_540.color;
              current_index[0x17] = local_540.palette_index;
              local_568 = color_00;
              _mesh_make_vertex(&local_564,pos_x_01,pos_y_00,pos_z_01,1.0,0.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x18] = (uint32_t)local_564.pos.x;
              current_index[0x19] = (uint32_t)local_564.pos.y;
              current_index[0x1a] = (uint32_t)local_564.pos.z;
              current_index[0x1b] = (uint32_t)local_564.normal.x;
              current_index[0x1c] = (uint32_t)local_564.normal.y;
              current_index[0x1d] = (uint32_t)local_564.normal.z;
              current_index[0x1e] = (uint32_t)local_564.color;
              current_index[0x1f] = local_564.palette_index;
              *(int32_t *)local_448 = k;
              *(int32_t *)((long)local_448 + 4) = k + 1;
              *(int32_t *)(local_448 + 1) = k + 2;
              *(int32_t *)((long)local_448 + 0xc) = k + 2;
              *(int32_t *)(local_448 + 2) = k + 3;
              *(int32_t *)((long)local_448 + 0x14) = k;
              k = k + 4;
              current_index = current_index + 0x20;
              local_448 = local_448 + 3;
            }
            if (local_7ab != 0) {
              local_58c = color_00;
              _mesh_make_vertex(&local_588,pos_x_00,pos_y_00,pos_z_00,0.0,-1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0] = (uint32_t)local_588.pos.x;
              current_index[1] = (uint32_t)local_588.pos.y;
              current_index[2] = (uint32_t)local_588.pos.z;
              current_index[3] = (uint32_t)local_588.normal.x;
              current_index[4] = (uint32_t)local_588.normal.y;
              current_index[5] = (uint32_t)local_588.normal.z;
              current_index[6] = (uint32_t)local_588.color;
              current_index[7] = local_588.palette_index;
              local_5b0 = color_00;
              _mesh_make_vertex(&local_5ac,pos_x_01,pos_y_00,pos_z_00,0.0,-1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[8] = (uint32_t)local_5ac.pos.x;
              current_index[9] = (uint32_t)local_5ac.pos.y;
              current_index[10] = (uint32_t)local_5ac.pos.z;
              current_index[0xb] = (uint32_t)local_5ac.normal.x;
              current_index[0xc] = (uint32_t)local_5ac.normal.y;
              current_index[0xd] = (uint32_t)local_5ac.normal.z;
              current_index[0xe] = (uint32_t)local_5ac.color;
              current_index[0xf] = local_5ac.palette_index;
              local_5d4 = color_00;
              _mesh_make_vertex(&local_5d0,pos_x_01,pos_y_00,pos_z_01,0.0,-1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x10] = (uint32_t)local_5d0.pos.x;
              current_index[0x11] = (uint32_t)local_5d0.pos.y;
              current_index[0x12] = (uint32_t)local_5d0.pos.z;
              current_index[0x13] = (uint32_t)local_5d0.normal.x;
              current_index[0x14] = (uint32_t)local_5d0.normal.y;
              current_index[0x15] = (uint32_t)local_5d0.normal.z;
              current_index[0x16] = (uint32_t)local_5d0.color;
              current_index[0x17] = local_5d0.palette_index;
              local_5f8 = color_00;
              _mesh_make_vertex(&local_5f4,pos_x_00,pos_y_00,pos_z_01,0.0,-1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x18] = (uint32_t)local_5f4.pos.x;
              current_index[0x19] = (uint32_t)local_5f4.pos.y;
              current_index[0x1a] = (uint32_t)local_5f4.pos.z;
              current_index[0x1b] = (uint32_t)local_5f4.normal.x;
              current_index[0x1c] = (uint32_t)local_5f4.normal.y;
              current_index[0x1d] = (uint32_t)local_5f4.normal.z;
              current_index[0x1e] = (uint32_t)local_5f4.color;
              current_index[0x1f] = local_5f4.palette_index;
              *(int32_t *)local_448 = k;
              *(int32_t *)((long)local_448 + 4) = k + 1;
              *(int32_t *)(local_448 + 1) = k + 2;
              *(int32_t *)((long)local_448 + 0xc) = k + 2;
              *(int32_t *)(local_448 + 2) = k + 3;
              *(int32_t *)((long)local_448 + 0x14) = k;
              k = k + 4;
              current_index = current_index + 0x20;
              local_448 = local_448 + 3;
            }
            if (local_7ac != 0) {
              local_61c = color_00;
              _mesh_make_vertex(&local_618,pos_x_00,pos_y_01,pos_z_00,0.0,1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0] = (uint32_t)local_618.pos.x;
              current_index[1] = (uint32_t)local_618.pos.y;
              current_index[2] = (uint32_t)local_618.pos.z;
              current_index[3] = (uint32_t)local_618.normal.x;
              current_index[4] = (uint32_t)local_618.normal.y;
              current_index[5] = (uint32_t)local_618.normal.z;
              current_index[6] = (uint32_t)local_618.color;
              current_index[7] = local_618.palette_index;
              local_640 = color_00;
              _mesh_make_vertex(&local_63c,pos_x_01,pos_y_01,pos_z_00,0.0,1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[8] = (uint32_t)local_63c.pos.x;
              current_index[9] = (uint32_t)local_63c.pos.y;
              current_index[10] = (uint32_t)local_63c.pos.z;
              current_index[0xb] = (uint32_t)local_63c.normal.x;
              current_index[0xc] = (uint32_t)local_63c.normal.y;
              current_index[0xd] = (uint32_t)local_63c.normal.z;
              current_index[0xe] = (uint32_t)local_63c.color;
              current_index[0xf] = local_63c.palette_index;
              local_664 = color_00;
              _mesh_make_vertex(&local_660,pos_x_01,pos_y_01,pos_z_01,0.0,1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x10] = (uint32_t)local_660.pos.x;
              current_index[0x11] = (uint32_t)local_660.pos.y;
              current_index[0x12] = (uint32_t)local_660.pos.z;
              current_index[0x13] = (uint32_t)local_660.normal.x;
              current_index[0x14] = (uint32_t)local_660.normal.y;
              current_index[0x15] = (uint32_t)local_660.normal.z;
              current_index[0x16] = (uint32_t)local_660.color;
              current_index[0x17] = local_660.palette_index;
              local_688 = color_00;
              _mesh_make_vertex(&local_684,pos_x_00,pos_y_01,pos_z_01,0.0,1.0,0.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x18] = (uint32_t)local_684.pos.x;
              current_index[0x19] = (uint32_t)local_684.pos.y;
              current_index[0x1a] = (uint32_t)local_684.pos.z;
              current_index[0x1b] = (uint32_t)local_684.normal.x;
              current_index[0x1c] = (uint32_t)local_684.normal.y;
              current_index[0x1d] = (uint32_t)local_684.normal.z;
              current_index[0x1e] = (uint32_t)local_684.color;
              current_index[0x1f] = local_684.palette_index;
              *(int32_t *)local_448 = k + 2;
              *(int32_t *)((long)local_448 + 4) = k + 1;
              *(int32_t *)(local_448 + 1) = k;
              *(int32_t *)((long)local_448 + 0xc) = k;
              *(int32_t *)(local_448 + 2) = k + 3;
              *(int32_t *)((long)local_448 + 0x14) = k + 2;
              k = k + 4;
              current_index = current_index + 0x20;
              local_448 = local_448 + 3;
            }
            if (local_7ad != 0) {
              local_6ac = color_00;
              _mesh_make_vertex(&local_6a8,pos_x_00,pos_y_00,pos_z_00,0.0,0.0,-1.0,color_00,
                                (uint)*_total_index_count);
              current_index[0] = (uint32_t)local_6a8.pos.x;
              current_index[1] = (uint32_t)local_6a8.pos.y;
              current_index[2] = (uint32_t)local_6a8.pos.z;
              current_index[3] = (uint32_t)local_6a8.normal.x;
              current_index[4] = (uint32_t)local_6a8.normal.y;
              current_index[5] = (uint32_t)local_6a8.normal.z;
              current_index[6] = (uint32_t)local_6a8.color;
              current_index[7] = local_6a8.palette_index;
              local_6d0 = color_00;
              _mesh_make_vertex(&local_6cc,pos_x_01,pos_y_00,pos_z_00,0.0,0.0,-1.0,color_00,
                                (uint)*_total_index_count);
              current_index[8] = (uint32_t)local_6cc.pos.x;
              current_index[9] = (uint32_t)local_6cc.pos.y;
              current_index[10] = (uint32_t)local_6cc.pos.z;
              current_index[0xb] = (uint32_t)local_6cc.normal.x;
              current_index[0xc] = (uint32_t)local_6cc.normal.y;
              current_index[0xd] = (uint32_t)local_6cc.normal.z;
              current_index[0xe] = (uint32_t)local_6cc.color;
              current_index[0xf] = local_6cc.palette_index;
              local_6f4 = color_00;
              _mesh_make_vertex(&local_6f0,pos_x_01,pos_y_01,pos_z_00,0.0,0.0,-1.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x10] = (uint32_t)local_6f0.pos.x;
              current_index[0x11] = (uint32_t)local_6f0.pos.y;
              current_index[0x12] = (uint32_t)local_6f0.pos.z;
              current_index[0x13] = (uint32_t)local_6f0.normal.x;
              current_index[0x14] = (uint32_t)local_6f0.normal.y;
              current_index[0x15] = (uint32_t)local_6f0.normal.z;
              current_index[0x16] = (uint32_t)local_6f0.color;
              current_index[0x17] = local_6f0.palette_index;
              local_718 = color_00;
              _mesh_make_vertex(&local_714,pos_x_00,pos_y_01,pos_z_00,0.0,0.0,-1.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x18] = (uint32_t)local_714.pos.x;
              current_index[0x19] = (uint32_t)local_714.pos.y;
              current_index[0x1a] = (uint32_t)local_714.pos.z;
              current_index[0x1b] = (uint32_t)local_714.normal.x;
              current_index[0x1c] = (uint32_t)local_714.normal.y;
              current_index[0x1d] = (uint32_t)local_714.normal.z;
              current_index[0x1e] = (uint32_t)local_714.color;
              current_index[0x1f] = local_714.palette_index;
              *(int32_t *)local_448 = k + 2;
              *(int32_t *)((long)local_448 + 4) = k + 1;
              *(int32_t *)(local_448 + 1) = k;
              *(int32_t *)((long)local_448 + 0xc) = k;
              *(int32_t *)(local_448 + 2) = k + 3;
              *(int32_t *)((long)local_448 + 0x14) = k + 2;
              k = k + 4;
              current_index = current_index + 0x20;
              local_448 = local_448 + 3;
            }
            if (local_7ae != 0) {
              local_73c = color_00;
              _mesh_make_vertex(&local_738,pos_x_00,pos_y_00,pos_z_01,0.0,0.0,1.0,color_00,
                                (uint)*_total_index_count);
              current_index[0] = (uint32_t)local_738.pos.x;
              current_index[1] = (uint32_t)local_738.pos.y;
              current_index[2] = (uint32_t)local_738.pos.z;
              current_index[3] = (uint32_t)local_738.normal.x;
              current_index[4] = (uint32_t)local_738.normal.y;
              current_index[5] = (uint32_t)local_738.normal.z;
              current_index[6] = (uint32_t)local_738.color;
              current_index[7] = local_738.palette_index;
              local_760 = color_00;
              _mesh_make_vertex(&local_75c,pos_x_01,pos_y_00,pos_z_01,0.0,0.0,1.0,color_00,
                                (uint)*_total_index_count);
              current_index[8] = (uint32_t)local_75c.pos.x;
              current_index[9] = (uint32_t)local_75c.pos.y;
              current_index[10] = (uint32_t)local_75c.pos.z;
              current_index[0xb] = (uint32_t)local_75c.normal.x;
              current_index[0xc] = (uint32_t)local_75c.normal.y;
              current_index[0xd] = (uint32_t)local_75c.normal.z;
              current_index[0xe] = (uint32_t)local_75c.color;
              current_index[0xf] = local_75c.palette_index;
              local_784 = color_00;
              _mesh_make_vertex(&local_780,pos_x_01,pos_y_01,pos_z_01,0.0,0.0,1.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x10] = (uint32_t)local_780.pos.x;
              current_index[0x11] = (uint32_t)local_780.pos.y;
              current_index[0x12] = (uint32_t)local_780.pos.z;
              current_index[0x13] = (uint32_t)local_780.normal.x;
              current_index[0x14] = (uint32_t)local_780.normal.y;
              current_index[0x15] = (uint32_t)local_780.normal.z;
              current_index[0x16] = (uint32_t)local_780.color;
              current_index[0x17] = local_780.palette_index;
              _mesh_make_vertex(&local_7a4,pos_x_00,pos_y_01,pos_z_01,0.0,0.0,1.0,color_00,
                                (uint)*_total_index_count);
              current_index[0x18] = (uint32_t)local_7a4.pos.x;
              current_index[0x19] = (uint32_t)local_7a4.pos.y;
              current_index[0x1a] = (uint32_t)local_7a4.pos.z;
              current_index[0x1b] = (uint32_t)local_7a4.normal.x;
              current_index[0x1c] = (uint32_t)local_7a4.normal.y;
              current_index[0x1d] = (uint32_t)local_7a4.normal.z;
              current_index[0x1e] = (uint32_t)local_7a4.color;
              current_index[0x1f] = local_7a4.palette_index;
              *(int32_t *)local_448 = k;
              *(int32_t *)((long)local_448 + 4) = k + 1;
              *(int32_t *)(local_448 + 1) = k + 2;
              *(int32_t *)((long)local_448 + 0xc) = k + 2;
              *(int32_t *)(local_448 + 2) = k + 3;
              *(int32_t *)((long)local_448 + 0x14) = k;
              k = k + 4;
              current_index = current_index + 0x20;
              local_448 = local_448 + 3;
            }
            (*stream_func)((uint32_t)min_x,(uint32_t)max_y,(uint32_t)max_z,
                           (ogt_mesh_vertex *)(local_index + 0x22),iVar4 * 4,
                           (uint32_t *)&current_vertex,iVar4 * 6,stream_func_data);
          }
        }
        _total_index_count = _total_index_count + 1;
      }
    }
  }
  return;
}

Assistant:

void ogt_stream_from_paletted_voxels_simple(
    const uint8_t* voxels, uint32_t size_x, uint32_t size_y, uint32_t size_z, const ogt_mesh_rgba* palette,
    ogt_voxel_simple_stream_func stream_func, void* stream_func_data) 
{
    assert(stream_func);
    const int32_t k_stride_x = 1;
    const int32_t k_stride_y = size_x;
    const int32_t k_stride_z = size_x * size_y;
    const int32_t k_max_x = size_x - 1;
    const int32_t k_max_y = size_y - 1;
    const int32_t k_max_z = size_z - 1;
    
    const uint8_t* current_voxel = voxels;

    uint32_t total_vertex_count = 0;
    uint32_t total_index_count = 0;
    for (int32_t k = 0; k < (int32_t)size_z; k++)
    {
        const float min_z = (float)k;
        const float max_z = min_z + 1.0f;
        for (int32_t j = 0; j < (int32_t)size_y; j++)
        {
            const float min_y = (float)j;
            const float max_y = min_y + 1.0f;
            for (int32_t i = 0; i < (int32_t)size_x; i++, current_voxel++)
            {
                // current voxel slot is empty? skip it.
                if (current_voxel[0] == 0)
                    continue;

                ogt_mesh_rgba color = palette[ current_voxel[0]];
                
                // determine the min/max coords of the voxel for each dimension.
                const float min_x = (float)i;
                const float max_x = min_x + 1.0f;

                // determine which faces we need to generate
                uint32_t neg_x = ((i == 0)       || (current_voxel[-k_stride_x] == 0));
                uint32_t pos_x = ((i == k_max_x) || (current_voxel[ k_stride_x] == 0));
                uint32_t neg_y = ((j == 0)       || (current_voxel[-k_stride_y] == 0));
                uint32_t pos_y = ((j == k_max_y) || (current_voxel[ k_stride_y] == 0));
                uint32_t neg_z = ((k == 0)       || (current_voxel[-k_stride_z] == 0));
                uint32_t pos_z = ((k == k_max_z) || (current_voxel[ k_stride_z] == 0));

                // count the number of faces. skip if zero.
                const uint32_t face_count_needed = (neg_x + pos_x + neg_y + pos_y + neg_z + pos_z);
                if (!face_count_needed)
                    continue;

                // generate geometry for this voxel to a local buffer first.
                ogt_mesh_vertex  local_vertex[24];
                uint32_t         local_index[36];
                ogt_mesh_vertex* current_vertex = local_vertex;
                uint32_t*        current_index  = local_index;

                // -X direction face
                if (neg_x)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( min_x, max_y, min_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( min_x, max_y, max_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, min_y, max_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                
                // +X direction face
                if (pos_x)
                {
                    current_vertex[0] = _mesh_make_vertex( max_x, min_y, min_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, max_y, min_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( max_x, min_y, max_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                
                // -Y direction face
                if (neg_y)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, min_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, min_y, max_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, min_y, max_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                // +Y direction face
                if (pos_y)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, max_y, min_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, max_y, min_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, max_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
               }
                // -Z direction face
                if (neg_z)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                // +Z direction face
                if (pos_z)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }

                // geometry for this voxel is provided to a caller-specified stream function/callback
                stream_func(i, j, k, local_vertex, face_count_needed*4, local_index, face_count_needed*6, stream_func_data);
            }
        }
    }	

}